

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_0::TessCoordComponent::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition caseDef)

{
  uint uVar1;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)24>_> data_05;
  RefData<vk::VkCommandBuffer_s_*> data_06;
  RefData<vk::Handle<(vk::HandleType)18>_> data_07;
  const_iterator cVar4;
  bool bVar5;
  byte bVar6;
  deUint32 queueFamilyIndex_00;
  int iVar7;
  deUint32 stride;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  const_reference pvVar8;
  const_reference pvVar9;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  Handle<(vk::HandleType)21> *pHVar10;
  Handle<(vk::HandleType)19> *pHVar11;
  VkBuffer *pVVar12;
  Handle<(vk::HandleType)22> *pHVar13;
  DescriptorSetUpdateBuilder *this_01;
  Handle<(vk::HandleType)17> *pHVar14;
  Handle<(vk::HandleType)24> *pHVar15;
  GraphicsPipelineBuilder *pGVar16;
  ProgramCollection<vk::ProgramBinary> *pPVar17;
  ProgramBinary *pPVar18;
  Handle<(vk::HandleType)16> *pHVar19;
  TestContext *pTVar20;
  TestLog *pTVar21;
  MessageBuilder *pMVar22;
  Allocation *pAVar23;
  void *pvVar24;
  VkDeviceMemory VVar25;
  VkDeviceSize VVar26;
  VkCommandBuffer_s **ppVVar27;
  Handle<(vk::HandleType)23> *pHVar28;
  Handle<(vk::HandleType)18> *pHVar29;
  uint *puVar30;
  reference this_02;
  de *this_03;
  pointer pVVar31;
  TessPrimitiveType primitiveType;
  code *pcVar32;
  Vector<float,_3> *value;
  Vector<float,_2> *value_00;
  Vector<float,_3> *local_e90;
  allocator<char> local_c11;
  string local_c10;
  allocator<char> local_be9;
  string local_be8;
  TestStatus local_bc8;
  undefined1 local_ba0 [8];
  string local_b98;
  MessageBuilder local_b78;
  int local_9f4;
  const_iterator cStack_9f0;
  int i_1;
  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  local_9e8;
  const_iterator vertexIter;
  CompareFunc compare;
  int numComponents;
  TestLog *log;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> vertices;
  deInt32 numVertices;
  Allocation *resultAlloc;
  undefined1 local_990 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  VkDeviceSize vertexBufferOffset;
  Allocation *alloc_1;
  Allocation *alloc;
  MessageBuilder local_8f0;
  int local_76c;
  VkRenderPass VStack_768;
  int tessLevelCaseNdx;
  VkPipelineLayout local_760;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  GraphicsPipelineBuilder local_6e0;
  Move<vk::Handle<(vk::HandleType)18>_> local_5d8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_5b8;
  undefined1 local_598 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::VkCommandBuffer_s_*> local_570;
  RefData<vk::VkCommandBuffer_s_*> local_550;
  undefined1 local_530 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4f0;
  undefined1 local_4d0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_4a8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_488;
  undefined1 local_468 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_440;
  RefData<vk::Handle<(vk::HandleType)23>_> local_420;
  undefined1 local_400 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_3c0;
  undefined1 local_3a0 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  DescriptorSetUpdateBuilder local_370;
  deUint64 local_328;
  undefined1 local_320 [8];
  VkDescriptorBufferInfo resultBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_2f8;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2d8;
  undefined1 local_2b8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_280;
  RefData<vk::Handle<(vk::HandleType)21>_> local_260;
  undefined1 local_240 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_1d8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_1b8;
  undefined1 local_198 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_170;
  undefined1 local_138 [8];
  Buffer resultBuffer;
  VkDeviceSize resultBufferSizeBytes;
  int resultBufferTessCoordsOffset;
  undefined1 local_c0 [8];
  Buffer vertexBuffer;
  VkDeviceSize vertexDataSizeBytes;
  deUint32 vertexStride;
  VkFormat vertexFormat;
  int local_68;
  int local_64;
  int i;
  int maxNumVerticesInDrawCall;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  int numTessLevelCases;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,9);
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  queue_00 = Context::getUniversalQueue(context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex(context);
  allocator_00 = Context::getDefaultAllocator(context);
  tessLevelCases.
  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x20;
  genTessLevelCases((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                     *)&i,0x20);
  local_64 = 0;
  for (local_68 = 0; local_68 < 0x20; local_68 = local_68 + 1) {
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&i,(long)local_68);
    pvVar9 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&i,(long)local_68);
    iVar7 = referenceVertexCount
                      (caseDef.primitiveType,caseDef.spacingMode,(bool)(caseDef.usePointMode & 1),
                       pvVar8->inner,pvVar9->outer);
    local_64 = de::max<int>(local_64,iVar7);
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(format);
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ZEXT48(stride * 6);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)&resultBufferTessCoordsOffset,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x80
            );
  tessellation::Buffer::Buffer
            ((Buffer *)local_c0,vk_00,device_00,allocator_00,
             (VkBufferCreateInfo *)&resultBufferTessCoordsOffset,
             ::vk::MemoryRequirement::HostVisible);
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = (long)(local_64 + 4) * 0x10 + 0x10;
  makeBufferCreateInfo
            (&local_170,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0x20
            );
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_138,vk_00,device_00,allocator_00,&local_170,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  this = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                   ((DescriptorSetLayoutBuilder *)
                    &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                     m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build(&local_1d8,this,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b8,(Move *)&local_1d8);
  data.deleter.m_deviceIface._0_4_ = (int)local_1b8.deleter.m_deviceIface;
  data.object.m_internal = local_1b8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_1b8.deleter.m_device;
  data.deleter.m_allocator._0_4_ = (int)local_1b8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_1b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_198,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_1d8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_280,this_00,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_260,(Move *)&local_280);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_260.deleter.m_deviceIface;
  data_00.object.m_internal = local_260.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_260.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_260.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_260.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_260.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_240,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_280);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_240);
  descriptorPool_00.m_internal = pHVar10->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_198);
  resultBufferInfo.range = pHVar11->m_internal;
  makeDescriptorSet(&local_2f8,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)resultBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&local_2f8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_2d8.deleter.m_deviceIface;
  data_01.object.m_internal = local_2d8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2d8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_2d8.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_2d8.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_2d8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2b8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_2f8);
  pVVar12 = tessellation::Buffer::get((Buffer *)local_138);
  local_328 = pVVar12->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_320,(VkBuffer)local_328,0,
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_370);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
  destSet.m_internal = pHVar13->m_internal;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_01 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_370,destSet,
                       (Location *)
                       &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_320);
  ::vk::DescriptorSetUpdateBuilder::update(this_01,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_370);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3c0,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3c0.deleter.m_deviceIface;
  data_02.object.m_internal = local_3c0.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c0.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_3c0.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_3c0.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_3c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a0);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makeFramebufferWithoutAttachments
            (&local_440,vk_00,device_00,
             (VkRenderPass)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
             m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_420,(Move *)&local_440);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_420.deleter.m_deviceIface;
  data_03.object.m_internal = local_420.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_420.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_420.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_420.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_420.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_400,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_440);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_198);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar11->m_internal;
  makePipelineLayout(&local_4a8,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_488,(Move *)&local_4a8);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_488.deleter.m_deviceIface;
  data_04.object.m_internal = local_488.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_488.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device = local_488.deleter.m_device;
  data_04.deleter.m_allocator._0_4_ = (int)local_488.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_488.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_468,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_4a8);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4f0,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_4f0.deleter.m_deviceIface;
  data_05.object.m_internal = local_4f0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device = local_4f0.deleter.m_device;
  data_05.deleter.m_allocator._0_4_ = (int)local_4f0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_4f0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4d0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4d0);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  ::vk::allocateCommandBuffer
            (&local_570,vk_00,device_00,
             (VkCommandPool)
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_550,(Move *)&local_570);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_550.deleter.m_deviceIface;
  data_06.object = local_550.object;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_550.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device = local_550.deleter.m_device;
  data_06.deleter.m_pool.m_internal._0_4_ = (int)local_550.deleter.m_pool.m_internal;
  data_06.deleter.m_pool.m_internal._4_4_ = (int)(local_550.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_530,data_06);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_570);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_6e0);
  pGVar16 = GraphicsPipelineBuilder::setPatchControlPoints(&local_6e0,6);
  pGVar16 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      (pGVar16,VK_FORMAT_R32_SFLOAT,stride);
  pPVar17 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"vert",&local_701);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_700);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"tesc",&local_729);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_728);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_750,"tese",&local_751);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_750);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_468);
  local_760.m_internal = pHVar19->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a0);
  VStack_768.m_internal = pHVar14->m_internal;
  pcVar32 = (code *)device_00;
  GraphicsPipelineBuilder::build(&local_5d8,pGVar16,vk_00,device_00,local_760,VStack_768);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5b8,(Move *)&local_5d8);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_5b8.deleter.m_deviceIface;
  data_07.object.m_internal = local_5b8.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5b8.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device = local_5b8.deleter.m_device;
  data_07.deleter.m_allocator._0_4_ = (int)local_5b8.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_5b8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_598,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_5d8);
  std::__cxx11::string::~string((string *)&local_750);
  std::allocator<char>::~allocator(&local_751);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_6e0);
  for (local_76c = 0; primitiveType = (TessPrimitiveType)pcVar32, local_76c < 0x20;
      local_76c = local_76c + 1) {
    pTVar20 = Context::getTestContext(context);
    pTVar21 = tcu::TestContext::getLog(pTVar20);
    tcu::TestLog::operator<<(&local_8f0,pTVar21,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar22 = tcu::MessageBuilder::operator<<
                        (&local_8f0,(char (*) [35])"Testing with tessellation levels: ");
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&i,(long)local_76c);
    getTessellationLevelsString_abi_cxx11_
              ((string *)&alloc,(tessellation *)pvVar8,(TessLevels *)(ulong)caseDef.primitiveType,
               primitiveType);
    pMVar22 = tcu::MessageBuilder::operator<<
                        (pMVar22,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&alloc);
    tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&alloc);
    tcu::MessageBuilder::~MessageBuilder(&local_8f0);
    pAVar23 = tessellation::Buffer::getAllocation((Buffer *)local_c0);
    pvVar24 = ::vk::Allocation::getHostPtr(pAVar23);
    pvVar8 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[]((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         *)&i,(long)local_76c);
    ::deMemcpy(pvVar24,pvVar8,0x18);
    VVar25 = ::vk::Allocation::getMemory(pAVar23);
    VVar26 = ::vk::Allocation::getOffset(pAVar23);
    ::vk::flushMappedMemoryRange(vk_00,device_00,VVar25,VVar26,0x18);
    pAVar23 = tessellation::Buffer::getAllocation((Buffer *)local_138);
    pvVar24 = ::vk::Allocation::getHostPtr(pAVar23);
    ::deMemset(pvVar24,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    VVar25 = ::vk::Allocation::getMemory(pAVar23);
    VVar26 = ::vk::Allocation::getOffset(pAVar23);
    ::vk::flushMappedMemoryRange
              (vk_00,device_00,VVar25,VVar26,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    beginCommandBuffer(vk_00,*ppVVar27);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    commandBuffer = *ppVVar27;
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a0);
    renderPass_00.m_internal = pHVar14->m_internal;
    pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_400);
    beginRenderPassWithRasterizationDisabled
              (vk_00,commandBuffer,renderPass_00,(VkFramebuffer)pHVar28->m_internal);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    pVVar2 = *ppVVar27;
    pHVar29 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_598);
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar29->m_internal);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    pVVar2 = *ppVVar27;
    pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_468);
    dVar3 = pHVar19->m_internal;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
    (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar2,0,dVar3,0,1,pHVar13,0,0);
    shaderWriteBarrier.size = 0;
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    pVVar2 = *ppVVar27;
    pVVar12 = tessellation::Buffer::get((Buffer *)local_c0);
    (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,pVVar2,0,1,pVVar12,&shaderWriteBarrier.size);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar27,6,1,0);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    endRenderPass(vk_00,*ppVVar27);
    pVVar12 = tessellation::Buffer::operator*((Buffer *)local_138);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_990,0x40,0x2000,(VkBuffer)pVVar12->m_internal,0,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    iVar7 = 0;
    (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar27,0x8000,0x4000,0,0,0,1,local_990,0,0);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    endCommandBuffer(vk_00,*ppVVar27);
    ppVVar27 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_530);
    submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar27);
    pAVar23 = tessellation::Buffer::getAllocation((Buffer *)local_138);
    VVar25 = ::vk::Allocation::getMemory(pAVar23);
    VVar26 = ::vk::Allocation::getOffset(pAVar23);
    ::vk::invalidateMappedMemoryRange
              (vk_00,device_00,VVar25,VVar26,
               resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_);
    puVar30 = (uint *)::vk::Allocation::getHostPtr(pAVar23);
    uVar1 = *puVar30;
    vertices.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar1;
    pvVar24 = ::vk::Allocation::getHostPtr(pAVar23);
    readInterleavedData<tcu::Vector<float,3>>
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)&log,
               (tessellation *)(ulong)uVar1,(int)pvVar24,(void *)0x10,0x10,iVar7);
    pTVar20 = Context::getTestContext(context);
    pTVar21 = tcu::TestContext::getLog(pTVar20);
    pcVar32 = (code *)0x2;
    if (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      pcVar32 = (code *)0x3;
    }
    iVar7 = (int)pcVar32;
    if (caseDef.caseType == CASETYPE_TESS_COORD_RANGE) {
      local_e90 = (Vector<float,_3> *)compareTessCoordRange;
    }
    else {
      local_e90 = (Vector<float,_3> *)0x0;
      pcVar32 = compareOneMinusTessCoord;
      if (caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD) {
        local_e90 = (Vector<float,_3> *)compareOneMinusTessCoord;
      }
    }
    vertexIter._M_current = local_e90;
    local_9e8._M_current =
         (Vector<float,_3> *)
         std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::begin
                   ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)&log);
    while( true ) {
      cStack_9f0 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::end
                             ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               *)&log);
      bVar5 = __gnu_cxx::operator!=(&local_9e8,&stack0xfffffffffffff610);
      if (!bVar5) break;
      for (local_9f4 = 0; cVar4._M_current = vertexIter._M_current, local_9f4 < iVar7;
          local_9f4 = local_9f4 + 1) {
        this_02 = __gnu_cxx::
                  __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                  ::operator*(&local_9e8);
        pcVar32 = (code *)tcu::Vector<float,_3>::operator[](this_02,local_9f4);
        bVar6 = (*(code *)cVar4._M_current)(*(undefined4 *)pcVar32,pTVar21);
        if ((bVar6 & 1) == 0) {
          tcu::TestLog::operator<<(&local_b78,pTVar21,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar22 = tcu::MessageBuilder::operator<<
                              (&local_b78,
                               (char (*) [43])"Note: got a wrong tessellation coordinate ");
          if (iVar7 == 3) {
            this_03 = (de *)__gnu_cxx::
                            __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                            ::operator*(&local_9e8);
            de::toString<tcu::Vector<float,3>>((string *)(local_ba0 + 8),this_03,value);
          }
          else {
            pVVar31 = __gnu_cxx::
                      __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                      ::operator->(&local_9e8);
            pcVar32 = (code *)0x1;
            tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_ba0,(int)pVVar31,0);
            de::toString<tcu::Vector<float,2>>((string *)(local_ba0 + 8),(de *)local_ba0,value_00);
          }
          pMVar22 = tcu::MessageBuilder::operator<<
                              (pMVar22,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(local_ba0 + 8));
          tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)(local_ba0 + 8));
          tcu::MessageBuilder::~MessageBuilder(&local_b78);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_be8,"Invalid tessellation coordinate component",&local_be9);
          tcu::TestStatus::fail(&local_bc8,&local_be8);
          tcu::TestStatus::~TestStatus(&local_bc8);
          std::__cxx11::string::~string((string *)&local_be8);
          std::allocator<char>::~allocator(&local_be9);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
      ::operator++(&local_9e8);
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)&log);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c10,"OK",&local_c11);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_c10);
  std::__cxx11::string::~string((string *)&local_c10);
  std::allocator<char>::~allocator(&local_c11);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_598);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_530);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_468);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_400);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_2b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_240);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_198);
  tessellation::Buffer::~Buffer((Buffer *)local_138);
  tessellation::Buffer::~Buffer((Buffer *)local_c0);
  std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
  ~vector((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_> *)
          &i);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const int						numTessLevelCases	= 32;
	const std::vector<TessLevels>	tessLevelCases		= genTessLevelCases(numTessLevelCases);

	int maxNumVerticesInDrawCall = 0;
	for (int i = 0; i < numTessLevelCases; ++i)
		maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(caseDef.primitiveType, caseDef.spacingMode, caseDef.usePointMode,
										   &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]));

	// We may get more invocations than expected, so add some more space (arbitrary number).
	maxNumVerticesInDrawCall += 4;

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat		vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32		vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize	vertexDataSizeBytes = NUM_TESS_LEVELS * vertexStride;
	const Buffer		vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(vertexDataSizeBytes == sizeof(TessLevels));

	// Output buffer: number of invocations and array of tess coords

	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + maxNumVerticesInDrawCall * sizeof(tcu::Vec4);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setPatchControlPoints        (NUM_TESS_LEVELS)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get("tese"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; ++tessLevelCaseNdx)
	{
		context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Testing with tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], caseDef.primitiveType)
			<< tcu::TestLog::EndMessage;

		{
			const Allocation& alloc = vertexBuffer.getAllocation();
			deMemcpy(alloc.getHostPtr(), &tessLevelCases[tessLevelCaseNdx], sizeof(TessLevels));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, NUM_TESS_LEVELS, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify case result
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32				 numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3> vertices    = readInterleavedData<tcu::Vec3>(numVertices, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));

			// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
			DE_ASSERT(numVertices <= maxNumVerticesInDrawCall);

			tcu::TestLog& log           = context.getTestContext().getLog();
			const int     numComponents = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

			CompareFunc compare = (caseDef.caseType == CASETYPE_TESS_COORD_RANGE     ? compareTessCoordRange :
								   caseDef.caseType == CASETYPE_ONE_MINUS_TESS_COORD ? compareOneMinusTessCoord : DE_NULL);

			DE_ASSERT(compare != DE_NULL);

			for (std::vector<tcu::Vec3>::const_iterator vertexIter = vertices.begin(); vertexIter != vertices.end(); ++vertexIter)
			for (int i = 0; i < numComponents; ++i)
				if (!compare(log, (*vertexIter)[i]))
				{
						log << tcu::TestLog::Message << "Note: got a wrong tessellation coordinate "
							<< (numComponents == 3 ? de::toString(*vertexIter) : de::toString(vertexIter->swizzle(0,1))) << tcu::TestLog::EndMessage;

						tcu::TestStatus::fail("Invalid tessellation coordinate component");
				}
		}
	}
	return tcu::TestStatus::pass("OK");
}